

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_expr.cpp
# Opt level: O0

void nivalis::anon_unknown_3::skip_ast(ASTNode **ast)

{
  uint32_t opcode;
  ASTNode **in_RDI;
  size_t i;
  size_t n_args;
  uint32_t opc;
  ASTNode **init_pos;
  ulong local_28;
  ulong local_20;
  ASTNode **ast_00;
  
  opcode = (*in_RDI)->opcode;
  ast_00 = in_RDI;
  local_20 = OpCode::n_args(opcode);
  if (opcode == 0xc) {
    local_20 = (ulong)((*in_RDI)->field_1).call_info[1];
  }
  *in_RDI = *in_RDI + 1;
  for (local_28 = 0; local_28 < local_20; local_28 = local_28 + 1) {
    skip_ast(ast_00);
  }
  return;
}

Assistant:

void skip_ast(const Expr::ASTNode** ast) {
    const auto* init_pos = ast;
    auto opc = (*ast)->opcode;
    size_t n_args = OpCode::n_args(opc);
    if (opc == OpCode::call) {
        n_args = (*ast)->call_info[1];
    }
    ++*ast;
    for (size_t i = 0; i < n_args; ++i) skip_ast(ast);
}